

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

void __thiscall
StunMsgCxx_RFC5769SampleIPv4Response_Test::TestBody(StunMsgCxx_RFC5769SampleIPv4Response_Test *this)

{
  bool bVar1;
  base_message<std::allocator<unsigned_char>_> *pbVar2;
  char *pcVar3;
  uint8_t *vec_b;
  pointer pdVar4;
  char *pcVar5;
  char *in_R9;
  xor_socket_address xVar6;
  iterator iVar7;
  string local_628;
  AssertHelper local_608;
  Message local_600;
  decoded local_5f8;
  decoded local_5e8;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_5a8;
  Message local_5a0;
  attribute_base<_stun_attr_uint32> local_598;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__7;
  Message local_570;
  uint16_t local_566;
  attribute_type local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_530;
  Message local_528;
  decoded local_520;
  decoded local_510;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_4d0;
  Message local_4c8;
  allocator<char> local_4b9;
  string local_4b8;
  attribute_base<_stun_attr_msgint> local_498;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__5;
  Message local_470;
  uint16_t local_466;
  attribute_type local_464;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_430;
  Message local_428;
  decoded local_420;
  decoded local_410;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__4;
  Message local_3e8;
  int local_3e0 [2];
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_7;
  Message local_3c0;
  uint16_t local_3b2;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_6;
  Message local_398;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_358;
  Message local_350;
  attribute_base<_stun_attr_sockaddr> local_348;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__3;
  sockaddr_in test_addr;
  Message local_310;
  uint16_t local_306;
  attribute_type local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2d0;
  Message local_2c8;
  decoded local_2c0;
  decoded local_2b0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__2;
  Message local_288;
  attribute_base<_stun_attr_varsize> local_280;
  string local_270;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  uint16_t local_22e;
  attribute_type local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1f8;
  Message local_1f0;
  decoded local_1e8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__1;
  iterator i;
  Message local_1b0;
  uint16_t local_1a6;
  type local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_148;
  Message local_140;
  size_t local_138;
  unsigned_long local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  msgint local_110;
  xor_socket_address local_100 [2];
  varsize<char> local_e0;
  undefined1 local_c0 [8];
  message message;
  sockaddr_in ipv4;
  uint8_t tsx_id [12];
  uint8_t expected_result [80];
  char password [23];
  char software_name [12];
  StunMsgCxx_RFC5769SampleIPv4Response_Test *this_local;
  
  stack0xffffffffffffffe0 = 0x6365762074736574;
  password[8] = 'W';
  password[9] = 'v';
  password[10] = 'J';
  password[0xb] = 'x';
  password[0xc] = 'B';
  password[0xd] = 't';
  password[0xe] = '\0';
  builtin_memcpy(expected_result + 0x48,"VOkJxbRl",8);
  password[0] = '1';
  password[1] = 'R';
  password[2] = 'm';
  password[3] = 'T';
  password[4] = 'x';
  password[5] = 'U';
  password[6] = 'k';
  password[7] = '/';
  expected_result[0x38] = '*';
  expected_result[0x39] = 0xf9;
  expected_result[0x3a] = 0xba;
  expected_result[0x3b] = 'S';
  expected_result[0x3c] = 0xf0;
  expected_result[0x3d] = 'k';
  expected_result[0x3e] = 0xe7;
  expected_result[0x3f] = 0xd7;
  expected_result[0x40] = 0x80;
  expected_result[0x41] = '(';
  expected_result[0x42] = '\0';
  expected_result[0x43] = '\x04';
  expected_result[0x44] = 0xc0;
  expected_result[0x45] = '}';
  expected_result[0x46] = 'L';
  expected_result[0x47] = 0x96;
  expected_result[0x28] = '\0';
  expected_result[0x29] = '\b';
  expected_result[0x2a] = '\0';
  expected_result[0x2b] = '\x14';
  expected_result[0x2c] = '+';
  expected_result[0x2d] = 0x91;
  expected_result[0x2e] = 0xf5;
  expected_result[0x2f] = 0x99;
  expected_result[0x30] = 0xfd;
  expected_result[0x31] = 0x9e;
  expected_result[0x32] = 0x90;
  expected_result[0x33] = 0xc3;
  expected_result[0x34] = 0x8c;
  expected_result[0x35] = 't';
  expected_result[0x36] = 0x89;
  expected_result[0x37] = 0xf9;
  builtin_memcpy(expected_result + 0x18,"tor ",5);
  expected_result[0x1d] = ' ';
  expected_result[0x1e] = '\0';
  expected_result[0x1f] = '\b';
  expected_result[0x20] = '\0';
  expected_result[0x21] = '\x01';
  expected_result[0x22] = 0xa1;
  expected_result[0x23] = 'G';
  expected_result[0x24] = 0xe1;
  expected_result[0x25] = '\x12';
  expected_result[0x26] = 0xa6;
  expected_result[0x27] = 'C';
  expected_result[8] = 0xfa;
  expected_result[9] = 0x87;
  expected_result[10] = 0xdf;
  expected_result[0xb] = 0xae;
  expected_result[0xc] = 0x80;
  expected_result[0xd] = '\"';
  expected_result[0xe] = '\0';
  expected_result[0xf] = '\v';
  expected_result[0x10] = 't';
  expected_result[0x11] = 'e';
  expected_result[0x12] = 's';
  expected_result[0x13] = 't';
  expected_result[0x14] = ' ';
  expected_result[0x15] = 'v';
  expected_result[0x16] = 'e';
  expected_result[0x17] = 'c';
  stack0xffffffffffffff78 = 0x42a412213c000101;
  expected_result[0] = 0xb7;
  expected_result[1] = 0xe7;
  expected_result[2] = 0xa7;
  expected_result[3] = '\x01';
  expected_result[4] = 0xbc;
  expected_result[5] = '4';
  expected_result[6] = 0xd6;
  expected_result[7] = 0x86;
  ipv4.sin_zero[0] = 0xb7;
  ipv4.sin_zero[1] = 0xe7;
  ipv4.sin_zero[2] = 0xa7;
  ipv4.sin_zero[3] = '\x01';
  ipv4.sin_zero[4] = 0xbc;
  ipv4.sin_zero[5] = '4';
  ipv4.sin_zero[6] = 0xd6;
  ipv4.sin_zero[7] = 0x86;
  tsx_id[0] = 0xfa;
  tsx_id[1] = 0x87;
  tsx_id[2] = 0xdf;
  tsx_id[3] = 0xae;
  message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 2;
  message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_2_ = htons(0x8055);
  inet_pton(2,"192.0.2.1",
            (void *)((long)&message.buffer_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_c0,0x101,ipv4.sin_zero);
  stun::attribute::software(&local_e0,password + 0x10,' ');
  pbVar2 = stun::operator<<((base_message<std::allocator<unsigned_char>_> *)local_c0,&local_e0);
  xVar6 = stun::attribute::xor_mapped_address
                    ((sockaddr_in *)
                     &message.buffer_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_100[0].addr_ = xVar6.addr_;
  local_100[0].type_ = xVar6.type_;
  pbVar2 = stun::operator<<(pbVar2,local_100);
  local_110 = stun::attribute::message_integrity((char *)(expected_result + 0x48));
  pbVar2 = stun::operator<<(pbVar2,&local_110);
  stun::attribute::fingerprint();
  stun::operator<<(pbVar2,(fingerprint *)((long)&gtest_ar.message_.ptr_ + 7));
  local_130 = 0x50;
  local_138 = stun::base_message<std::allocator<unsigned_char>_>::size
                        ((base_message<std::allocator<unsigned_char>_> *)local_c0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_128,"sizeof(expected_result)","message.size()",&local_130,
             &local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    vec_b = stun::base_message<std::allocator<unsigned_char>_>::data
                      ((base_message<std::allocator<unsigned_char>_> *)local_c0);
    anon_unknown.dwarf_f3ff::IsEqual((anon_unknown_dwarf_f3ff *)local_160,tsx_id + 8,vec_b,0x50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_160,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xed,pcVar3);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    local_1a4 = binding_response;
    local_1a6 = stun::base_message<std::allocator<unsigned_char>_>::type
                          ((base_message<std::allocator<unsigned_char>_> *)local_c0);
    testing::internal::EqHelper<false>::
    Compare<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((EqHelper<false> *)local_1a0,"stun::message::binding_response","message.type()",
               &local_1a4,&local_1a6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i.attr_.attr_hdr_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xf1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i.attr_.attr_hdr_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i.attr_.attr_hdr_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    iVar7 = stun::base_message<std::allocator<unsigned_char>_>::begin
                      ((base_message<std::allocator<unsigned_char>_> *)local_c0);
    i.attr_.msg_hdr_ = (stun_msg_hdr *)iVar7.attr_.attr_hdr_;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar7.attr_.msg_hdr_;
    local_1e8 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                   ((base_message<std::allocator<unsigned_char>_> *)local_c0);
    bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                      ((iterator *)&local_1e8,(self_type *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_1d8,bVar1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_1d8,
                 (AssertionResult *)"message.end() != i","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xf4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1f0);
    }
    gtest_ar_.message_.ptr_._5_3_ = 0;
    gtest_ar_.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    if (gtest_ar_.message_.ptr_._4_4_ == 0) {
      local_22c = software;
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_22e = stun::attribute::decoded::type(pdVar4);
      testing::internal::EqHelper<false>::
      Compare<stun::attribute::type::attribute_type,unsigned_short>
                ((EqHelper<false> *)local_228,"type::software","i->type()",&local_22c,&local_22e);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xf5,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_238);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_238);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_280 = (attribute_base<_stun_attr_varsize>)
                  stun::attribute::decoded::to<(stun::attribute::type::attribute_type)32802>(pdVar4)
      ;
      stun::attribute::decoding_bits::string::to_string_abi_cxx11_(&local_270,(string *)&local_280);
      testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
                ((EqHelper<false> *)local_250,"software_name","i->to<type::software>().to_string()",
                 (char (*) [12])(password + 0x10),&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
      if (!bVar1) {
        testing::Message::Message(&local_288);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xf7,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_288)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_288);
      }
      gtest_ar_.message_.ptr_._5_3_ = 0;
      gtest_ar_.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
      if (gtest_ar_.message_.ptr_._4_4_ == 0) {
        local_2b0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                       ((base_message<std::allocator<unsigned_char>_> *)local_c0);
        local_2c0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                             operator++((iterator *)&gtest_ar__1.message_);
        bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                          ((iterator *)&local_2b0,(self_type *)&local_2c0);
        testing::AssertionResult::AssertionResult((AssertionResult *)local_2a0,bVar1);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
        if (!bVar1) {
          testing::Message::Message(&local_2c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,(internal *)local_2a0,
                     (AssertionResult *)"message.end() != ++i","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0xf9,pcVar3);
          testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
          testing::internal::AssertHelper::~AssertHelper(&local_2d0);
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_2c8);
        }
        gtest_ar_.message_.ptr_._5_3_ = 0;
        gtest_ar_.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
        if (gtest_ar_.message_.ptr_._4_4_ == 0) {
          local_304 = xor_mapped_address;
          pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                             ((iterator *)&gtest_ar__1.message_);
          local_306 = stun::attribute::decoded::type(pdVar4);
          testing::internal::EqHelper<false>::
          Compare<stun::attribute::type::attribute_type,unsigned_short>
                    ((EqHelper<false> *)local_300,"type::xor_mapped_address","i->type()",&local_304,
                     &local_306);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
          if (!bVar1) {
            testing::Message::Message(&local_310);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)test_addr.sin_zero,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0xfa,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)test_addr.sin_zero,&local_310);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)test_addr.sin_zero);
            testing::Message::~Message(&local_310);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
          gtest_ar__3.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          test_addr.sin_family = 0;
          test_addr.sin_port = 0;
          test_addr.sin_addr.s_addr = 0;
          pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                             ((iterator *)&gtest_ar__1.message_);
          local_348 = (attribute_base<_stun_attr_sockaddr>)
                      stun::attribute::decoded::to<(stun::attribute::type::attribute_type)32>
                                (pdVar4);
          bVar1 = stun::attribute::decoding_bits::xor_socket_address::to_sockaddr
                            ((xor_socket_address *)&local_348,(sockaddr *)&gtest_ar__3.message_);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_338,bVar1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
          if (!bVar1) {
            testing::Message::Message(&local_350);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_5.message_,(internal *)local_338,
                       (AssertionResult *)
                       "i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr)",
                       "false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_358,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0xfe,pcVar3);
            testing::internal::AssertHelper::operator=(&local_358,&local_350);
            testing::internal::AssertHelper::~AssertHelper(&local_358);
            std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_350);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
          local_38c = 2;
          testing::internal::EqHelper<false>::Compare<int,unsigned_short>
                    ((EqHelper<false> *)local_388,"2","test_addr.sin_family",&local_38c,
                     (unsigned_short *)&gtest_ar__3.message_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
          if (!bVar1) {
            testing::Message::Message(&local_398);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0xff,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_398);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_398);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
          local_3b2 = htons(0x8055);
          testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
                    ((EqHelper<false> *)local_3b0,"htons(32853)","test_addr.sin_port",&local_3b2,
                     (unsigned_short *)((long)&gtest_ar__3.message_.ptr_ + 2));
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
          if (!bVar1) {
            testing::Message::Message(&local_3c0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x100,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_3c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_3c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
          local_3e0[1] = 0;
          local_3e0[0] = memcmp((void *)((long)&gtest_ar__3.message_.ptr_ + 4),
                                (void *)((long)&message.buffer_.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),4);
          pcVar3 = (char *)0x0;
          testing::internal::EqHelper<true>::Compare<int,int>
                    (local_3d8,"0",
                     (int *)"memcmp(&test_addr.sin_addr, &ipv4.sin_addr, sizeof(ipv4.sin_addr))",
                     local_3e0 + 1,local_3e0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
          if (!bVar1) {
            testing::Message::Message(&local_3e8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x102,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__4.message_,&local_3e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_3e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
          local_410 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                         ((base_message<std::allocator<unsigned_char>_> *)local_c0);
          local_420 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                               operator++((iterator *)&gtest_ar__1.message_);
          bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                            ((iterator *)&local_410,(self_type *)&local_420);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_400,bVar1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
          if (!bVar1) {
            testing::Message::Message(&local_428);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_8.message_,(internal *)local_400,
                       (AssertionResult *)"message.end() != ++i","false","true",pcVar3);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_430,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x104,pcVar5);
            testing::internal::AssertHelper::operator=(&local_430,&local_428);
            testing::internal::AssertHelper::~AssertHelper(&local_430);
            std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_428);
          }
          gtest_ar_.message_.ptr_._5_3_ = 0;
          gtest_ar_.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
          if (gtest_ar_.message_.ptr_._4_4_ == 0) {
            local_464 = message_integrity;
            pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                               ((iterator *)&gtest_ar__1.message_);
            local_466 = stun::attribute::decoded::type(pdVar4);
            testing::internal::EqHelper<false>::
            Compare<stun::attribute::type::attribute_type,unsigned_short>
                      ((EqHelper<false> *)local_460,"type::message_integrity","i->type()",&local_464
                       ,&local_466);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
            if (!bVar1) {
              testing::Message::Message(&local_470);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0x105,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__5.message_,&local_470);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_470);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
            pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                               ((iterator *)&gtest_ar__1.message_);
            local_498 = (attribute_base<_stun_attr_msgint>)
                        stun::attribute::decoded::to<(stun::attribute::type::attribute_type)8>
                                  (pdVar4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4b8,(char *)(expected_result + 0x48),&local_4b9);
            bVar1 = stun::attribute::decoding_bits::msgint::check_integrity
                              ((msgint *)&local_498,&local_4b8);
            testing::AssertionResult::AssertionResult((AssertionResult *)local_488,bVar1);
            std::__cxx11::string::~string((string *)&local_4b8);
            std::allocator<char>::~allocator(&local_4b9);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
            if (!bVar1) {
              testing::Message::Message(&local_4c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_488,
                         (AssertionResult *)
                         "i->to<type::message_integrity>().check_integrity(password)","false","true"
                         ,pcVar3);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_4d0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0x107,pcVar5);
              testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
              testing::internal::AssertHelper::~AssertHelper(&local_4d0);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_4c8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
            local_510 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                           ((base_message<std::allocator<unsigned_char>_> *)local_c0
                                           );
            local_520 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                 operator++((iterator *)&gtest_ar__1.message_);
            bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                              ((iterator *)&local_510,(self_type *)&local_520);
            testing::AssertionResult::AssertionResult((AssertionResult *)local_500,bVar1);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
            if (!bVar1) {
              testing::Message::Message(&local_528);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_9.message_,(internal *)local_500,
                         (AssertionResult *)"message.end() != ++i","false","true",pcVar3);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_530,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0x109,pcVar5);
              testing::internal::AssertHelper::operator=(&local_530,&local_528);
              testing::internal::AssertHelper::~AssertHelper(&local_530);
              std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
              testing::Message::~Message(&local_528);
            }
            gtest_ar_.message_.ptr_._5_3_ = 0;
            gtest_ar_.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
            if (gtest_ar_.message_.ptr_._4_4_ == 0) {
              local_564 = fingerprint;
              pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                 ((iterator *)&gtest_ar__1.message_);
              local_566 = stun::attribute::decoded::type(pdVar4);
              testing::internal::EqHelper<false>::
              Compare<stun::attribute::type::attribute_type,unsigned_short>
                        ((EqHelper<false> *)local_560,"type::fingerprint","i->type()",&local_564,
                         &local_566);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
              if (!bVar1) {
                testing::Message::Message(&local_570);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x10a,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__7.message_,&local_570);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_570);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
              pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                 ((iterator *)&gtest_ar__1.message_);
              local_598 = (attribute_base<_stun_attr_uint32>)
                          stun::attribute::decoded::to<(stun::attribute::type::attribute_type)32808>
                                    (pdVar4);
              bVar1 = stun::attribute::decoding_bits::fingerprint::check_integrity
                                ((fingerprint *)&local_598);
              testing::AssertionResult::AssertionResult((AssertionResult *)local_588,bVar1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
              if (!bVar1) {
                testing::Message::Message(&local_5a0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__8.message_,(internal *)local_588,
                           (AssertionResult *)"i->to<type::fingerprint>().check_integrity()","false"
                           ,"true",pcVar3);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_5a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x10c,pcVar5);
                testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
                testing::internal::AssertHelper::~AssertHelper(&local_5a8);
                std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                testing::Message::~Message(&local_5a0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
              local_5e8 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                             ((base_message<std::allocator<unsigned_char>_> *)
                                              local_c0);
              local_5f8 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                   operator++((iterator *)&gtest_ar__1.message_);
              bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator==
                                ((iterator *)&local_5e8,(self_type *)&local_5f8);
              testing::AssertionResult::AssertionResult((AssertionResult *)local_5d8,bVar1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
              if (!bVar1) {
                testing::Message::Message(&local_600);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_628,(internal *)local_5d8,
                           (AssertionResult *)"message.end() == ++i","false","true",pcVar3);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_608,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x10e,pcVar3);
                testing::internal::AssertHelper::operator=(&local_608,&local_600);
                testing::internal::AssertHelper::~AssertHelper(&local_608);
                std::__cxx11::string::~string((string *)&local_628);
                testing::Message::~Message(&local_600);
              }
              gtest_ar_.message_.ptr_._5_3_ = 0;
              gtest_ar_.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
              if (gtest_ar_.message_.ptr_._4_4_ == 0) {
                gtest_ar_.message_.ptr_._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  stun::base_message<std::allocator<unsigned_char>_>::~base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_c0);
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleIPv4Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x3c, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x08, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x01,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0xe1,0x12,0xa6,0x43, //    Xor'd mapped IPv4 address
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x2b,0x91,0xf5,0x99, // }
    0xfd,0x9e,0x90,0xc3, // }
    0x8c,0x74,0x89,0xf9, // }  HMAC-SHA1 fingerprint
    0x2a,0xf9,0xba,0x53, // }
    0xf0,0x6b,0xe7,0xd7, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc0,0x7d,0x4c,0x96, //    CRC32 fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in ipv4;
  ipv4.sin_family = AF_INET;
  ipv4.sin_port = htons(32853);
  inet_pton(AF_INET, "192.0.2.1", &ipv4.sin_addr);

  stun::message message(stun::message::binding_response, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::xor_mapped_address(ipv4)
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::xor_mapped_address, i->type());
  sockaddr_in test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_TRUE(
    i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET, test_addr.sin_family);
  EXPECT_EQ(htons(32853), test_addr.sin_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin_addr, &ipv4.sin_addr,
      sizeof(ipv4.sin_addr)));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}